

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Reference>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *result)

{
  Reference *__first;
  Reference *__last;
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined7 in_register_00000031;
  char cVar5;
  bool triple_deliminated;
  Reference ref;
  char c;
  bool local_1a5;
  undefined4 local_1a4;
  Reference local_1a0;
  string local_50;
  
  local_1a4 = (undefined4)CONCAT71(in_register_00000031,sep);
  __first = (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
            _M_impl.super__Vector_impl_data._M_start;
  __last = (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Reference*>(__first,__last);
    (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>)._M_impl.
    super__Vector_impl_data._M_finish = __first;
  }
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    local_1a0.asset_path.asset_path_._M_dataplus._M_p =
         (pointer)&local_1a0.asset_path.asset_path_.field_2;
    local_1a0.asset_path.asset_path_._M_string_length = 0;
    local_1a0.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
    local_1a0.asset_path.resolved_path_._M_dataplus._M_p =
         (pointer)&local_1a0.asset_path.resolved_path_.field_2;
    local_1a0.asset_path.resolved_path_._M_string_length = 0;
    local_1a0.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
    local_1a0.prim_path._prim_part._M_dataplus._M_p =
         (pointer)&local_1a0.prim_path._prim_part.field_2;
    local_1a0.prim_path._prim_part._M_string_length = 0;
    local_1a0.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
    local_1a0.prim_path._prop_part._M_dataplus._M_p =
         (pointer)&local_1a0.prim_path._prop_part.field_2;
    local_1a0.prim_path._prop_part._M_string_length = 0;
    local_1a0.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
    local_1a0.prim_path._variant_part._M_dataplus._M_p =
         (pointer)&local_1a0.prim_path._variant_part.field_2;
    local_1a0.prim_path._variant_part._M_string_length = 0;
    local_1a0.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
    local_1a0.prim_path._variant_selection_part._M_dataplus._M_p =
         (pointer)&local_1a0.prim_path._variant_selection_part.field_2;
    local_1a0.prim_path._variant_selection_part._M_string_length = 0;
    local_1a0.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
    local_1a0.prim_path._variant_part_str._M_dataplus._M_p =
         (pointer)&local_1a0.prim_path._variant_part_str.field_2;
    local_1a0.prim_path._variant_part_str._M_string_length = 0;
    local_1a0.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
    local_1a0.prim_path._element._M_dataplus._M_p = (pointer)&local_1a0.prim_path._element.field_2;
    local_1a0.prim_path._element._M_string_length = 0;
    local_1a0.prim_path._element.field_2._M_local_buf[0] = '\0';
    local_1a0.prim_path._path_type.has_value_ = false;
    local_1a0.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_1a0.prim_path._valid = false;
    local_1a0.layerOffset._offset = 0.0;
    local_1a0.layerOffset._scale = 1.0;
    local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a5 = false;
    local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar2 = ParseReference(this,&local_1a0,&local_1a5);
    if (bVar2) {
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::push_back
                (result,&local_1a0);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Failed to parse Reference.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    paVar4 = &local_1a0.asset_path.asset_path_.field_2;
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase(&local_1a0.customData._M_t,
               (_Link_type)
               local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.prim_path._element._M_dataplus._M_p != &local_1a0.prim_path._element.field_2) {
      operator_delete(local_1a0.prim_path._element._M_dataplus._M_p,
                      CONCAT71(local_1a0.prim_path._element.field_2._M_allocated_capacity._1_7_,
                               local_1a0.prim_path._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.prim_path._variant_part_str._M_dataplus._M_p !=
        &local_1a0.prim_path._variant_part_str.field_2) {
      operator_delete(local_1a0.prim_path._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_1a0.prim_path._variant_part_str.field_2._M_allocated_capacity.
                               _1_7_,local_1a0.prim_path._variant_part_str.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.prim_path._variant_selection_part._M_dataplus._M_p !=
        &local_1a0.prim_path._variant_selection_part.field_2) {
      operator_delete(local_1a0.prim_path._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_1a0.prim_path._variant_selection_part.field_2.
                               _M_allocated_capacity._1_7_,
                               local_1a0.prim_path._variant_selection_part.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.prim_path._variant_part._M_dataplus._M_p !=
        &local_1a0.prim_path._variant_part.field_2) {
      operator_delete(local_1a0.prim_path._variant_part._M_dataplus._M_p,
                      CONCAT71(local_1a0.prim_path._variant_part.field_2._M_allocated_capacity._1_7_
                               ,local_1a0.prim_path._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.prim_path._prop_part._M_dataplus._M_p !=
        &local_1a0.prim_path._prop_part.field_2) {
      operator_delete(local_1a0.prim_path._prop_part._M_dataplus._M_p,
                      CONCAT71(local_1a0.prim_path._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_1a0.prim_path._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.prim_path._prim_part._M_dataplus._M_p !=
        &local_1a0.prim_path._prim_part.field_2) {
      operator_delete(local_1a0.prim_path._prim_part._M_dataplus._M_p,
                      CONCAT71(local_1a0.prim_path._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_1a0.prim_path._prim_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.asset_path.resolved_path_._M_dataplus._M_p !=
        &local_1a0.asset_path.resolved_path_.field_2) {
      operator_delete(local_1a0.asset_path.resolved_path_._M_dataplus._M_p,
                      CONCAT71(local_1a0.asset_path.resolved_path_.field_2._M_allocated_capacity.
                               _1_7_,local_1a0.asset_path.resolved_path_.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.asset_path.asset_path_._M_dataplus._M_p != paVar4) {
      operator_delete(local_1a0.asset_path.asset_path_._M_dataplus._M_p,
                      CONCAT71(local_1a0.asset_path.asset_path_.field_2._M_allocated_capacity._1_7_,
                               local_1a0.asset_path.asset_path_.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      do {
        pSVar1 = this->_sr;
        if ((pSVar1->length_ <= pSVar1->idx_) || (pSVar1->binary_[pSVar1->idx_] == '\0'))
        goto LAB_003f75fe;
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar2) {
          return false;
        }
        bVar2 = Char1(this,(char *)&local_50);
        cVar5 = '\x01';
        if (bVar2) {
          if ((char)local_50._M_dataplus._M_p == (char)local_1a4) {
            bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar2) {
              bVar2 = LookChar1(this,(char *)&local_1a0);
              cVar5 = ((char)local_1a0.asset_path.asset_path_._M_dataplus._M_p == end_symbol) *
                      '\x03';
              if (!bVar2) {
                cVar5 = '\x01';
              }
              if ((char)local_1a0.asset_path.asset_path_._M_dataplus._M_p != end_symbol && bVar2)
              goto LAB_003f7330;
            }
          }
          else {
LAB_003f7330:
            if ((char)local_50._M_dataplus._M_p == (char)local_1a4) {
              cVar5 = '\x01';
              bVar2 = SkipWhitespaceAndNewline(this,true);
              if (bVar2) {
                local_1a0.asset_path.asset_path_._M_string_length = 0;
                local_1a0.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
                local_1a0.asset_path.resolved_path_._M_dataplus._M_p =
                     (pointer)&local_1a0.asset_path.resolved_path_.field_2;
                local_1a0.asset_path.resolved_path_._M_string_length = 0;
                local_1a0.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
                local_1a0.prim_path._prim_part._M_dataplus._M_p =
                     (pointer)&local_1a0.prim_path._prim_part.field_2;
                local_1a0.prim_path._prim_part._M_string_length = 0;
                local_1a0.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
                local_1a0.prim_path._prop_part._M_dataplus._M_p =
                     (pointer)&local_1a0.prim_path._prop_part.field_2;
                local_1a0.prim_path._prop_part._M_string_length = 0;
                local_1a0.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
                local_1a0.prim_path._variant_part._M_dataplus._M_p =
                     (pointer)&local_1a0.prim_path._variant_part.field_2;
                local_1a0.prim_path._variant_part._M_string_length = 0;
                local_1a0.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
                local_1a0.prim_path._variant_selection_part._M_dataplus._M_p =
                     (pointer)&local_1a0.prim_path._variant_selection_part.field_2;
                local_1a0.prim_path._variant_selection_part._M_string_length = 0;
                local_1a0.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
                local_1a0.prim_path._variant_part_str._M_dataplus._M_p =
                     (pointer)&local_1a0.prim_path._variant_part_str.field_2;
                local_1a0.prim_path._variant_part_str._M_string_length = 0;
                local_1a0.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
                local_1a0.prim_path._element._M_dataplus._M_p =
                     (pointer)&local_1a0.prim_path._element.field_2;
                local_1a0.prim_path._element._M_string_length = 0;
                local_1a0.prim_path._element.field_2._M_local_buf[0] = '\0';
                local_1a0.prim_path._path_type.has_value_ = false;
                local_1a0.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
                local_1a0.prim_path._valid = false;
                local_1a0.layerOffset._offset = 0.0;
                local_1a0.layerOffset._scale = 1.0;
                local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x0;
                local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header;
                local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_1a5 = false;
                local_1a0.asset_path.asset_path_._M_dataplus._M_p = (pointer)paVar4;
                local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                bVar2 = ParseReference(this,&local_1a0,&local_1a5);
                cVar5 = '\x03';
                if (bVar2) {
                  ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::
                  push_back(result,&local_1a0);
                  cVar5 = '\0';
                }
                ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                ::_M_erase(&local_1a0.customData._M_t,
                           (_Link_type)
                           local_1a0.customData._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0.prim_path._element._M_dataplus._M_p !=
                    &local_1a0.prim_path._element.field_2) {
                  operator_delete(local_1a0.prim_path._element._M_dataplus._M_p,
                                  CONCAT71(local_1a0.prim_path._element.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_1a0.prim_path._element.field_2._M_local_buf[0]) + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0.prim_path._variant_part_str._M_dataplus._M_p !=
                    &local_1a0.prim_path._variant_part_str.field_2) {
                  operator_delete(local_1a0.prim_path._variant_part_str._M_dataplus._M_p,
                                  CONCAT71(local_1a0.prim_path._variant_part_str.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_1a0.prim_path._variant_part_str.field_2.
                                           _M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0.prim_path._variant_selection_part._M_dataplus._M_p !=
                    &local_1a0.prim_path._variant_selection_part.field_2) {
                  operator_delete(local_1a0.prim_path._variant_selection_part._M_dataplus._M_p,
                                  CONCAT71(local_1a0.prim_path._variant_selection_part.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_1a0.prim_path._variant_selection_part.field_2.
                                           _M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0.prim_path._variant_part._M_dataplus._M_p !=
                    &local_1a0.prim_path._variant_part.field_2) {
                  operator_delete(local_1a0.prim_path._variant_part._M_dataplus._M_p,
                                  CONCAT71(local_1a0.prim_path._variant_part.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_1a0.prim_path._variant_part.field_2._M_local_buf[0]
                                          ) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0.prim_path._prop_part._M_dataplus._M_p !=
                    &local_1a0.prim_path._prop_part.field_2) {
                  operator_delete(local_1a0.prim_path._prop_part._M_dataplus._M_p,
                                  CONCAT71(local_1a0.prim_path._prop_part.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_1a0.prim_path._prop_part.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0.prim_path._prim_part._M_dataplus._M_p !=
                    &local_1a0.prim_path._prim_part.field_2) {
                  operator_delete(local_1a0.prim_path._prim_part._M_dataplus._M_p,
                                  CONCAT71(local_1a0.prim_path._prim_part.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_1a0.prim_path._prim_part.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0.asset_path.resolved_path_._M_dataplus._M_p !=
                    &local_1a0.asset_path.resolved_path_.field_2) {
                  operator_delete(local_1a0.asset_path.resolved_path_._M_dataplus._M_p,
                                  CONCAT71(local_1a0.asset_path.resolved_path_.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_1a0.asset_path.resolved_path_.field_2._M_local_buf
                                           [0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a0.asset_path.asset_path_._M_dataplus._M_p != paVar4) {
                  operator_delete(local_1a0.asset_path.asset_path_._M_dataplus._M_p,
                                  CONCAT71(local_1a0.asset_path.asset_path_.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_1a0.asset_path.asset_path_.field_2._M_local_buf[0])
                                  + 1);
                }
              }
            }
            else {
              pSVar1 = this->_sr;
              cVar5 = '\x03';
              if ((0 < (long)pSVar1->idx_) && (uVar3 = pSVar1->idx_ - 1, uVar3 <= pSVar1->length_))
              {
                pSVar1->idx_ = uVar3;
              }
            }
          }
        }
      } while (cVar5 == '\0');
      if (cVar5 != '\x01') {
LAB_003f75fe:
        if ((result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_1a0.asset_path.asset_path_._M_dataplus._M_p = (pointer)paVar4;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"Empty array.\n","");
        PushError(this,(string *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0.asset_path.asset_path_._M_dataplus._M_p != paVar4) {
          operator_delete(local_1a0.asset_path.asset_path_._M_dataplus._M_p,
                          CONCAT71(local_1a0.asset_path.asset_path_.field_2._M_allocated_capacity.
                                   _1_7_,local_1a0.asset_path.asset_path_.field_2._M_local_buf[0]) +
                          1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep,
                                  const char end_symbol,
                                  std::vector<Reference> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    Reference ref;
    bool triple_deliminated{false};

    if (!ParseReference(&ref, &triple_deliminated)) {
      PushError("Failed to parse Reference.\n");
      return false;
    }

    (void)triple_deliminated;

    result->push_back(ref);
  }

  while (!Eof()) {
    // sep
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    Reference ref;
    bool triple_deliminated{false};
    if (!ParseReference(&ref, &triple_deliminated)) {
      break;
    }

    (void)triple_deliminated;
    result->push_back(ref);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}